

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O2

void __thiscall
BasicContainer::build
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list,
          treenode **cur)

{
  pointer ppBVar1;
  BasicPrimitive *pBVar2;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var3;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __last;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  treenode *ptVar10;
  long lVar11;
  code *pcVar12;
  long lVar13;
  _Iter_comp_iter<bool_(*)(BasicPrimitive_*,_BasicPrimitive_*)> __comp;
  int i;
  ulong uVar14;
  int iVar15;
  int i_1;
  uint uVar16;
  uint uVar17;
  float fVar18;
  double dVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float local_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  double local_f8;
  undefined8 uStack_f0;
  vector<float,_std::allocator<float>_> prefix_area;
  vector<float,_std::allocator<float>_> suffix_area;
  _Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_60;
  _Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_48;
  
  ptVar10 = *cur;
  if (ptVar10 == (treenode *)0x0) {
    ptVar10 = (treenode *)operator_new(0x30);
    ptVar10->lc = (treenode *)0x0;
    ptVar10->rc = (treenode *)0x0;
    ptVar10->shape = (BasicPrimitive *)0x0;
    (ptVar10->bound).x1 = 0.0;
    (ptVar10->bound).x2 = 0.0;
    (ptVar10->bound).y1 = 0.0;
    (ptVar10->bound).y2 = 0.0;
    (ptVar10->bound).z1 = 0.0;
    (ptVar10->bound).z2 = 0.0;
    *cur = ptVar10;
  }
  ppBVar1 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppBVar1 == 8) {
    pBVar2 = *ppBVar1;
    ptVar10->shape = pBVar2;
    (*(pBVar2->super_Primitive)._vptr_Primitive[1])(&prefix_area);
    ptVar10 = *cur;
    *(pointer *)&(ptVar10->bound).z1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(pointer *)&ptVar10->bound =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)&(ptVar10->bound).y1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (*((*ppBVar1)->super_Primitive)._vptr_Primitive[1])((AABox *)&prefix_area);
    *(pointer *)&(ptVar10->bound).z1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(pointer *)&ptVar10->bound =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)&(ptVar10->bound).y1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar14 = 1;
    while( true ) {
      _Var3._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
      __last._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if ((ulong)((long)__last._M_current - (long)_Var3._M_current >> 3) <= uVar14) break;
      (*(_Var3._M_current[uVar14]->super_Primitive)._vptr_Primitive[1])((AABox *)&suffix_area);
      operator+((AABox *)&prefix_area,&ptVar10->bound,(AABox *)&suffix_area);
      *(pointer *)&(ptVar10->bound).z1 =
           prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      *(pointer *)&ptVar10->bound =
           prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)&(ptVar10->bound).y1 =
           prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar14 = uVar14 + 1;
    }
    fVar20 = (ptVar10->bound).y2 - (ptVar10->bound).y1;
    fVar18 = (ptVar10->bound).x2 - (ptVar10->bound).x1;
    pcVar12 = build::anon_class_1_0_00000001::__invoke;
    if (fVar18 < fVar20) {
      pcVar12 = build::anon_class_1_0_00000001::__invoke;
    }
    fVar23 = (ptVar10->bound).z2 - (ptVar10->bound).z1;
    __comp._M_comp = build::anon_class_1_0_00000001::__invoke;
    if (fVar23 <= fVar18 || fVar23 <= fVar20) {
      __comp._M_comp = pcVar12;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
              (_Var3,__last,__comp);
    prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              (&prefix_area,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<float,_std::allocator<float>_>::resize
              (&suffix_area,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&local_138);
    uVar14 = 0;
    while( true ) {
      ppBVar1 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1;
      if ((ulong)(lVar13 >> 3) <= uVar14) break;
      (*(ppBVar1[uVar14]->super_Primitive)._vptr_Primitive[1])(&local_118);
      fVar8 = fStack_10c;
      fVar7 = fStack_110;
      fVar6 = local_118;
      fVar5 = local_128;
      fVar4 = fStack_12c;
      fVar23 = fStack_130;
      fVar20 = fStack_134;
      fVar18 = local_138;
      local_f8._0_4_ = fStack_114;
      uStack_f0._0_4_ = fStack_10c;
      uStack_f0._4_4_ = local_108;
      local_11c = fminf(fStack_130,fStack_110);
      fStack_12c = fmaxf(fStack_12c,fStack_10c);
      fStack_130 = local_11c;
      auVar24._4_4_ = local_128;
      auVar24._0_4_ = fVar18;
      auVar24._8_4_ = fVar23;
      auVar24._12_4_ = fVar4;
      auVar28._4_4_ = local_108;
      auVar28._0_4_ = fVar6;
      auVar28._8_4_ = fVar7;
      auVar28._12_4_ = fVar8;
      auVar29 = minps(auVar28,auVar24);
      uVar16 = -(uint)NAN(fVar18);
      local_138 = (float)(~uVar16 & auVar29._0_4_ | (uint)fVar6 & uVar16);
      local_128 = (float)(~-(uint)NAN(local_128) & auVar29._4_4_ |
                         (uint)local_108 & -(uint)NAN(local_128));
      auVar21._4_4_ = fStack_124;
      auVar21._0_4_ = fVar20;
      auVar21._8_4_ = fVar4;
      auVar21._12_4_ = fVar5;
      auVar26._4_4_ = fStack_104;
      auVar26._0_4_ = local_f8._0_4_;
      auVar26._8_4_ = (float)uStack_f0;
      auVar26._12_4_ = uStack_f0._4_4_;
      auVar29 = maxps(auVar26,auVar21);
      uVar16 = -(uint)NAN(fVar20);
      fStack_134 = (float)(~uVar16 & auVar29._0_4_ | (uint)local_f8._0_4_ & uVar16);
      fStack_124 = (float)(~-(uint)NAN(fStack_124) & auVar29._4_4_ |
                          (uint)fStack_104 & -(uint)NAN(fStack_124));
      fVar18 = (fStack_124 - local_128) * (fStack_12c - local_11c) +
               (fStack_134 - local_138) * (fStack_12c - local_11c) +
               (fStack_134 - local_138) * (fStack_124 - local_128);
      prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar14] = fVar18 + fVar18;
      uVar14 = uVar14 + 1;
    }
    (**(code **)(**(long **)((long)ppBVar1 + lVar13 + -8) + 8))(&local_118);
    local_128 = local_108;
    fStack_124 = fStack_104;
    local_138 = local_118;
    fStack_134 = fStack_114;
    fStack_130 = fStack_110;
    fStack_12c = fStack_10c;
    uVar14 = (ulong)((long)(list->
                           super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(list->
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    while( true ) {
      uVar14 = uVar14 - 1;
      if ((int)(uint)uVar14 < 0) break;
      uVar16 = (uint)uVar14 & 0x7fffffff;
      (*((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar16]->super_Primitive)._vptr_Primitive[1])(&local_118);
      fVar8 = fStack_10c;
      fVar7 = fStack_110;
      fVar6 = local_118;
      fVar5 = local_128;
      fVar4 = fStack_12c;
      fVar23 = fStack_130;
      fVar20 = fStack_134;
      fVar18 = local_138;
      local_f8._0_4_ = fStack_114;
      uStack_f0._0_4_ = fStack_10c;
      uStack_f0._4_4_ = local_108;
      local_11c = fminf(fStack_130,fStack_110);
      fStack_12c = fmaxf(fStack_12c,fStack_10c);
      fStack_130 = local_11c;
      auVar25._4_4_ = local_128;
      auVar25._0_4_ = fVar18;
      auVar25._8_4_ = fVar23;
      auVar25._12_4_ = fVar4;
      auVar30._4_4_ = local_108;
      auVar30._0_4_ = fVar6;
      auVar30._8_4_ = fVar7;
      auVar30._12_4_ = fVar8;
      auVar29 = minps(auVar30,auVar25);
      uVar17 = -(uint)NAN(fVar18);
      local_138 = (float)(~uVar17 & auVar29._0_4_ | (uint)fVar6 & uVar17);
      local_128 = (float)(~-(uint)NAN(local_128) & auVar29._4_4_ |
                         (uint)local_108 & -(uint)NAN(local_128));
      auVar22._4_4_ = fStack_124;
      auVar22._0_4_ = fVar20;
      auVar22._8_4_ = fVar4;
      auVar22._12_4_ = fVar5;
      auVar27._4_4_ = fStack_104;
      auVar27._0_4_ = local_f8._0_4_;
      auVar27._8_4_ = (float)uStack_f0;
      auVar27._12_4_ = uStack_f0._4_4_;
      auVar29 = maxps(auVar27,auVar22);
      uVar17 = -(uint)NAN(fVar20);
      fStack_134 = (float)(~uVar17 & auVar29._0_4_ | (uint)local_f8._0_4_ & uVar17);
      fStack_124 = (float)(~-(uint)NAN(fStack_124) & auVar29._4_4_ |
                          (uint)fStack_104 & -(uint)NAN(fStack_124));
      fVar18 = (fStack_124 - local_128) * (fStack_12c - local_11c) +
               (fStack_134 - local_138) * (fStack_12c - local_11c) +
               (fStack_134 - local_138) * (fStack_124 - local_128);
      suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar16] = fVar18 + fVar18;
    }
    _Var3._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    lVar13 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)_Var3._M_current;
    lVar11 = lVar13 >> 3;
    auVar29._8_4_ = (int)(lVar13 >> 0x23);
    auVar29._0_8_ = lVar11;
    auVar29._12_4_ = 0x45300000;
    uStack_f0 = auVar29._8_8_ - 1.9342813113834067e+25;
    local_f8 = uStack_f0 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    dVar19 = round(local_f8 * 0.15);
    iVar15 = (int)dVar19;
    dVar19 = round(local_f8 * 0.85);
    for (lVar13 = (long)iVar15; lVar13 < (int)(dVar19 + -1.0); lVar13 = lVar13 + 1) {
      iVar9 = (int)lVar13;
      if (prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[iVar15] +
          suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar15 + 1] <=
          prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13] +
          suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar13 + 1]) {
        iVar9 = iVar15;
      }
      iVar15 = iVar9;
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_48,_Var3,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(_Var3._M_current + (long)iVar15 + 1),(allocator_type *)&local_118);
    build(this,(vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_48,&(*cur)->lc)
    ;
    std::_Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~_Vector_base(&local_48)
    ;
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_60,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar15 + 1),
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_118);
    build(this,(vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_60,&(*cur)->rc)
    ;
    std::_Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~_Vector_base(&local_60)
    ;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&suffix_area.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&prefix_area.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

void build(std::vector<BasicPrimitive*> list, treenode*& cur)
	{
		// create tree node
		if (!cur) {
			cur = new treenode();
		}
		// bind shape to leaf nodes
		if (list.size() == 1)
		{
			cur->shape = list[0];
			cur->bound = list[0]->boundingVolume();
			return;
		}
		// compute bounding box
		AABox& bound = cur->bound;
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
		// sort in sparsest dimension
		auto cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
			return a->boundingVolume().x1 < b->boundingVolume().x1;
		};
		if (bound.y2 - bound.y1 > bound.x2 - bound.x1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().y1 < b->boundingVolume().y1;
			};
		}
		if (bound.z2 - bound.z1 > bound.x2 - bound.x1 &&
			bound.z2 - bound.z1 > bound.y2 - bound.y1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().z1 < b->boundingVolume().z1;
			};
		}
		std::sort(list.begin(), list.end(), cmp);
		// determine split position to minimize sum of surface area of bounding boxes
		std::vector<float> prefix_area, suffix_area;
		prefix_area.resize(list.size());
		suffix_area.resize(list.size());
		AABox accu = list[0]->boundingVolume();
		for (int i=0; i<list.size(); ++i) {
			accu = accu + list[i]->boundingVolume();
			prefix_area[i] = accu.surfaceArea();
		}
		accu = list[list.size()-1]->boundingVolume();
		for (int i=list.size()-1; i>=0; --i) {
			accu = accu + list[i]->boundingVolume();
			suffix_area[i] = accu.surfaceArea();
		}
		int rangemin = round(list.size()*0.15);
		int rangemax = round(list.size()*0.85)-1;
		// limit split point from being too close to side
		int best = rangemin;
		for (int i=rangemin; i<rangemax; ++i) {
			if (prefix_area[i] + suffix_area[i+1] < prefix_area[best] + suffix_area[best+1])
				best = i;
		}
		// recursive partition
		build(std::vector<BasicPrimitive*>(list.begin(), list.begin()+best+1), cur->lc);
		build(std::vector<BasicPrimitive*>(list.begin()+best+1, list.end()), cur->rc);
	}